

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O3

JITTimePolymorphicInlineCacheInfo * __thiscall
JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(JITTimeWorkItem *this,intptr_t funcBodyAddr)

{
  PolymorphicInlineCacheInfoIDL *pPVar1;
  ulong uVar2;
  
  uVar2 = (ulong)this->m_workItemData->inlineeInfoCount;
  if (uVar2 != 0) {
    pPVar1 = this->m_workItemData->inlineeInfo;
    do {
      if ((pPVar1->functionBodyAddr).ptr == (void *)funcBodyAddr) {
        return (JITTimePolymorphicInlineCacheInfo *)pPVar1;
      }
      pPVar1 = pPVar1 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return (JITTimePolymorphicInlineCacheInfo *)0x0;
}

Assistant:

JITTimePolymorphicInlineCacheInfo *
JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(intptr_t funcBodyAddr)
{
    for (uint i = 0; i < m_workItemData->inlineeInfoCount; ++i)
    {
        if (m_workItemData->inlineeInfo[i].functionBodyAddr == (void*)funcBodyAddr)
        {
            return (JITTimePolymorphicInlineCacheInfo *)&m_workItemData->inlineeInfo[i];
        }
    }
    return nullptr;
}